

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db)

{
  Db *pDVar1;
  Btree *p;
  Schema *pSVar2;
  VTable *pVVar3;
  FuncDef *pFVar4;
  void *p_00;
  Module *pMod;
  int iVar5;
  VTable *pVTab;
  HashElem *pHVar6;
  long lVar7;
  long lVar8;
  FuncDef *p_01;
  
  if (db->eOpenState == 0xa7) {
    iVar5 = connectionIsBusy(db);
    if (iVar5 == 0) {
      sqlite3RollbackAll(db,0);
      sqlite3CloseSavepoints(db);
      if (0 < db->nDb) {
        lVar7 = 8;
        lVar8 = 0;
        do {
          pDVar1 = db->aDb;
          p = *(Btree **)((long)&pDVar1->zDbSName + lVar7);
          if (p != (Btree *)0x0) {
            sqlite3BtreeClose(p);
            *(undefined8 *)((long)&pDVar1->zDbSName + lVar7) = 0;
            if (lVar8 != 1) {
              *(undefined8 *)(&pDVar1->safety_level + lVar7) = 0;
            }
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x20;
        } while (lVar8 < db->nDb);
      }
      pSVar2 = db->aDb[1].pSchema;
      if (pSVar2 != (Schema *)0x0) {
        sqlite3SchemaClear(pSVar2);
      }
      pVTab = db->pDisconnect;
      if (pVTab != (VTable *)0x0) {
        db->pDisconnect = (VTable *)0x0;
        do {
          pVVar3 = pVTab->pNext;
          sqlite3VtabUnlock(pVTab);
          pVTab = pVVar3;
        } while (pVVar3 != (VTable *)0x0);
      }
      sqlite3CollapseDatabaseArray(db);
      for (pHVar6 = (db->aFunc).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
        p_01 = (FuncDef *)pHVar6->data;
        do {
          functionDestroy(db,p_01);
          pFVar4 = p_01->pNext;
          if (p_01 != (FuncDef *)0x0) {
            sqlite3DbFreeNN(db,p_01);
          }
          p_01 = pFVar4;
        } while (pFVar4 != (FuncDef *)0x0);
      }
      sqlite3HashClear(&db->aFunc);
      for (pHVar6 = (db->aCollSeq).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
        p_00 = pHVar6->data;
        lVar7 = 0x20;
        do {
          if (*(code **)((long)p_00 + lVar7) != (code *)0x0) {
            (**(code **)((long)p_00 + lVar7))(*(undefined8 *)((long)p_00 + lVar7 + -0x10));
          }
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != 0x98);
        if (p_00 != (void *)0x0) {
          sqlite3DbFreeNN(db,p_00);
        }
      }
      sqlite3HashClear(&db->aCollSeq);
      for (pHVar6 = (db->aModule).first; pHVar6 != (HashElem *)0x0; pHVar6 = pHVar6->next) {
        pMod = (Module *)pHVar6->data;
        sqlite3VtabEponymousTableClear(db,pMod);
        sqlite3VtabModuleUnref(db,pMod);
      }
      sqlite3HashClear(&db->aModule);
      db->errCode = 0;
      if (db->pErr == (sqlite3_value *)0x0) {
        db->errByteOffset = -1;
      }
      else {
        sqlite3ErrorFinish(db,0);
      }
      sqlite3ValueFree(db->pErr);
      if (0 < db->nExtension) {
        lVar7 = 0;
        do {
          (*db->pVfs->xDlClose)(db->pVfs,db->aExtension[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < db->nExtension);
      }
      if (db->aExtension != (void **)0x0) {
        sqlite3DbFreeNN(db,db->aExtension);
      }
      db->eOpenState = 0xd5;
      pSVar2 = db->aDb[1].pSchema;
      if (pSVar2 != (Schema *)0x0) {
        sqlite3DbFreeNN(db,pSVar2);
      }
      if (db->xAutovacDestr != (_func_void_void_ptr *)0x0) {
        (*db->xAutovacDestr)(db->pAutovacPagesArg);
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      db->eOpenState = 0xce;
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(db->mutex);
      }
      if ((db->lookaside).bMalloced != '\0') {
        sqlite3_free((db->lookaside).pStart);
      }
      sqlite3_free(db);
      return;
    }
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3LeaveMutexAndCloseZombie(sqlite3 *db){
  HashElem *i;                    /* Hash table iterator */
  int j;

  /* If there are outstanding sqlite3_stmt or sqlite3_backup objects
  ** or if the connection has not yet been closed by sqlite3_close_v2(),
  ** then just leave the mutex and return.
  */
  if( db->eOpenState!=SQLITE_STATE_ZOMBIE || connectionIsBusy(db) ){
    sqlite3_mutex_leave(db->mutex);
    return;
  }

  /* If we reach this point, it means that the database connection has
  ** closed all sqlite3_stmt and sqlite3_backup objects and has been
  ** passed to sqlite3_close (meaning that it is a zombie).  Therefore,
  ** go ahead and free all resources.
  */

  /* If a transaction is open, roll it back. This also ensures that if
  ** any database schemas have been modified by an uncommitted transaction
  ** they are reset. And that the required b-tree mutex is held to make
  ** the pager rollback and schema reset an atomic operation. */
  sqlite3RollbackAll(db, SQLITE_OK);

  /* Free any outstanding Savepoint structures. */
  sqlite3CloseSavepoints(db);

  /* Close all database connections */
  for(j=0; j<db->nDb; j++){
    struct Db *pDb = &db->aDb[j];
    if( pDb->pBt ){
      sqlite3BtreeClose(pDb->pBt);
      pDb->pBt = 0;
      if( j!=1 ){
        pDb->pSchema = 0;
      }
    }
  }
  /* Clear the TEMP schema separately and last */
  if( db->aDb[1].pSchema ){
    sqlite3SchemaClear(db->aDb[1].pSchema);
  }
  sqlite3VtabUnlockList(db);

  /* Free up the array of auxiliary databases */
  sqlite3CollapseDatabaseArray(db);
  assert( db->nDb<=2 );
  assert( db->aDb==db->aDbStatic );

  /* Tell the code in notify.c that the connection no longer holds any
  ** locks and does not require any further unlock-notify callbacks.
  */
  sqlite3ConnectionClosed(db);

  for(i=sqliteHashFirst(&db->aFunc); i; i=sqliteHashNext(i)){
    FuncDef *pNext, *p;
    p = sqliteHashData(i);
    do{
      functionDestroy(db, p);
      pNext = p->pNext;
      sqlite3DbFree(db, p);
      p = pNext;
    }while( p );
  }
  sqlite3HashClear(&db->aFunc);
  for(i=sqliteHashFirst(&db->aCollSeq); i; i=sqliteHashNext(i)){
    CollSeq *pColl = (CollSeq *)sqliteHashData(i);
    /* Invoke any destructors registered for collation sequence user data. */
    for(j=0; j<3; j++){
      if( pColl[j].xDel ){
        pColl[j].xDel(pColl[j].pUser);
      }
    }
    sqlite3DbFree(db, pColl);
  }
  sqlite3HashClear(&db->aCollSeq);
#ifndef SQLITE_OMIT_VIRTUALTABLE
  for(i=sqliteHashFirst(&db->aModule); i; i=sqliteHashNext(i)){
    Module *pMod = (Module *)sqliteHashData(i);
    sqlite3VtabEponymousTableClear(db, pMod);
    sqlite3VtabModuleUnref(db, pMod);
  }
  sqlite3HashClear(&db->aModule);
#endif

  sqlite3Error(db, SQLITE_OK); /* Deallocates any cached error strings. */
  sqlite3ValueFree(db->pErr);
  sqlite3CloseExtensions(db);

  db->eOpenState = SQLITE_STATE_ERROR;

  /* The temp-database schema is allocated differently from the other schema
  ** objects (using sqliteMalloc() directly, instead of sqlite3BtreeSchema()).
  ** So it needs to be freed here. Todo: Why not roll the temp schema into
  ** the same sqliteMalloc() as the one that allocates the database
  ** structure?
  */
  sqlite3DbFree(db, db->aDb[1].pSchema);
  if( db->xAutovacDestr ){
    db->xAutovacDestr(db->pAutovacPagesArg);
  }
  sqlite3_mutex_leave(db->mutex);
  db->eOpenState = SQLITE_STATE_CLOSED;
  sqlite3_mutex_free(db->mutex);
  assert( sqlite3LookasideUsed(db,0)==0 );
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  sqlite3_free(db);
}